

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Saturation::ExtensionalityClause> * __thiscall
Lib::OptionBase<Saturation::ExtensionalityClause>::operator=
          (OptionBase<Saturation::ExtensionalityClause> *this,
          OptionBase<Saturation::ExtensionalityClause> *other)

{
  ExtensionalityClause *t;
  byte *in_RSI;
  OptionBase<Saturation::ExtensionalityClause> *in_RDI;
  ExtensionalityClause local_28;
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Saturation::ExtensionalityClause> *)0xac5fe7);
  }
  if ((*local_10 & 1) != 0) {
    t = unwrap((OptionBase<Saturation::ExtensionalityClause> *)0xac6008);
    move_if_value<Saturation::ExtensionalityClause,_true>(&local_28,t);
    MaybeUninit<Saturation::ExtensionalityClause>::init(&in_RDI->_elem,(EVP_PKEY_CTX *)&local_28);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }